

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evpath_dp.c
# Opt level: O3

void EvpathDestroyReader(CP_Services Svcs,DP_RS_Stream RS_Stream_v)

{
  long lVar1;
  long lVar2;
  
  pthread_mutex_lock((pthread_mutex_t *)((long)RS_Stream_v + 0x18));
  DiscardPriorPreloaded(Svcs,(Evpath_RS_Stream)RS_Stream_v,0x7fffffffffffffff);
  pthread_mutex_unlock((pthread_mutex_t *)((long)RS_Stream_v + 0x18));
  if (0 < *(int *)((long)RS_Stream_v + 0x44)) {
    lVar1 = 0;
    lVar2 = 0;
    do {
      free(*(void **)(*(long *)((long)RS_Stream_v + 0x50) + lVar1));
      lVar2 = lVar2 + 1;
      lVar1 = lVar1 + 0x10;
    } while (lVar2 < *(int *)((long)RS_Stream_v + 0x44));
  }
  free(*(void **)((long)RS_Stream_v + 0x50));
  free((void *)**(undefined8 **)((long)RS_Stream_v + 0x68));
  free(*(void **)((long)RS_Stream_v + 0x68));
  free(RS_Stream_v);
  return;
}

Assistant:

static void EvpathDestroyReader(CP_Services Svcs, DP_RS_Stream RS_Stream_v)
{
    Evpath_RS_Stream RS_Stream = (Evpath_RS_Stream)RS_Stream_v;
    pthread_mutex_lock(&RS_Stream->DataLock);
    DiscardPriorPreloaded(Svcs, RS_Stream, LONG_MAX);
    pthread_mutex_unlock(&RS_Stream->DataLock);
    for (int i = 0; i < RS_Stream->WriterCohortSize; i++)
    {
        free(RS_Stream->WriterContactInfo[i].ContactString);
    }
    free(RS_Stream->WriterContactInfo);
    free(RS_Stream->MyContactInfo->ContactString);
    free(RS_Stream->MyContactInfo);
    //    printf("Total read requests %ld, from preload %ld\n",
    //           RS_Stream->TotalReadRequests,
    //           RS_Stream->ReadRequestsFromPreload);
    free(RS_Stream);
}